

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Importer.cpp
# Opt level: O0

aiReturn __thiscall Assimp::Importer::UnregisterPPStep(Importer *this,BaseProcess *pImp)

{
  ImporterPimpl *pIVar1;
  bool bVar2;
  Logger *pLVar3;
  const_iterator local_58;
  __normal_iterator<Assimp::BaseProcess_**,_std::vector<Assimp::BaseProcess_*,_std::allocator<Assimp::BaseProcess_*>_>_>
  local_50 [3];
  BaseProcess **local_38;
  __normal_iterator<Assimp::BaseProcess_**,_std::vector<Assimp::BaseProcess_*,_std::allocator<Assimp::BaseProcess_*>_>_>
  local_30;
  __normal_iterator<Assimp::BaseProcess_**,_std::vector<Assimp::BaseProcess_*,_std::allocator<Assimp::BaseProcess_*>_>_>
  local_28;
  iterator it;
  BaseProcess *pImp_local;
  Importer *this_local;
  
  if (pImp == (BaseProcess *)0x0) {
    this_local._4_4_ = aiReturn_SUCCESS;
  }
  else {
    it._M_current = (BaseProcess **)pImp;
    local_30._M_current =
         (BaseProcess **)
         std::vector<Assimp::BaseProcess_*,_std::allocator<Assimp::BaseProcess_*>_>::begin
                   (&this->pimpl->mPostProcessingSteps);
    local_38 = (BaseProcess **)
               std::vector<Assimp::BaseProcess_*,_std::allocator<Assimp::BaseProcess_*>_>::end
                         (&this->pimpl->mPostProcessingSteps);
    local_28 = std::
               find<__gnu_cxx::__normal_iterator<Assimp::BaseProcess**,std::vector<Assimp::BaseProcess*,std::allocator<Assimp::BaseProcess*>>>,Assimp::BaseProcess*>
                         (local_30,(__normal_iterator<Assimp::BaseProcess_**,_std::vector<Assimp::BaseProcess_*,_std::allocator<Assimp::BaseProcess_*>_>_>
                                    )local_38,(BaseProcess **)&it);
    local_50[0]._M_current =
         (BaseProcess **)
         std::vector<Assimp::BaseProcess_*,_std::allocator<Assimp::BaseProcess_*>_>::end
                   (&this->pimpl->mPostProcessingSteps);
    bVar2 = __gnu_cxx::operator!=(&local_28,local_50);
    if (bVar2) {
      pIVar1 = this->pimpl;
      __gnu_cxx::
      __normal_iterator<Assimp::BaseProcess*const*,std::vector<Assimp::BaseProcess*,std::allocator<Assimp::BaseProcess*>>>
      ::__normal_iterator<Assimp::BaseProcess**>
                ((__normal_iterator<Assimp::BaseProcess*const*,std::vector<Assimp::BaseProcess*,std::allocator<Assimp::BaseProcess*>>>
                  *)&local_58,&local_28);
      std::vector<Assimp::BaseProcess_*,_std::allocator<Assimp::BaseProcess_*>_>::erase
                (&pIVar1->mPostProcessingSteps,local_58);
      pLVar3 = DefaultLogger::get();
      Logger::info(pLVar3,"Unregistering custom post-processing step");
      this_local._4_4_ = aiReturn_SUCCESS;
    }
    else {
      pLVar3 = DefaultLogger::get();
      Logger::warn(pLVar3,"Unable to remove custom post-processing step: I can\'t find you ..");
      this_local._4_4_ = aiReturn_FAILURE;
    }
  }
  return this_local._4_4_;
}

Assistant:

aiReturn Importer::UnregisterPPStep(BaseProcess* pImp) {
    if(!pImp) {
        // unregistering a NULL ppstep is no problem for us ... really!
        return AI_SUCCESS;
    }

    ASSIMP_BEGIN_EXCEPTION_REGION();
    std::vector<BaseProcess*>::iterator it = std::find(pimpl->mPostProcessingSteps.begin(),
        pimpl->mPostProcessingSteps.end(),pImp);

    if (it != pimpl->mPostProcessingSteps.end())    {
        pimpl->mPostProcessingSteps.erase(it);
        ASSIMP_LOG_INFO("Unregistering custom post-processing step");
        return AI_SUCCESS;
    }
    ASSIMP_LOG_WARN("Unable to remove custom post-processing step: I can't find you ..");
    ASSIMP_END_EXCEPTION_REGION(aiReturn);

    return AI_FAILURE;
}